

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::zbranch(Forth *this)

{
  uint uVar1;
  Cell CVar2;
  Xt XVar3;
  
  requireDStackDepth(this,1,"(ZBRANCH)");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  if (uVar1 == this->False) {
    CVar2 = dataSpaceAtCell(this,this->next_command);
    XVar3 = CVar2 + this->next_command;
  }
  else {
    XVar3 = this->next_command + 4;
  }
  this->next_command = XVar3;
  return;
}

Assistant:

void zbranch() {
			REQUIRE_DSTACK_DEPTH(1, "(ZBRANCH)");
			auto flag = dStack.getTop(); pop();
			if (flag == False)
				branch();
			else
				next_command += sizeof(next_command); 
		}